

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O1

void ncnn::conv3x3s1_winograd63(Mat *bottom_blob,Mat *top_blob,Mat *AT,Mat *bias,int nT,Option *opt)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int *piVar11;
  _func_int ***ppp_Var12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined1 (*pauVar20) [32];
  undefined1 (*pauVar21) [16];
  undefined4 *puVar22;
  void *pvVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  undefined8 *puVar29;
  undefined8 *puVar30;
  float *pfVar31;
  float *pfVar32;
  ulong uVar33;
  long lVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  long lVar38;
  int iVar39;
  uint uVar40;
  uint uVar41;
  int iVar42;
  uint uVar43;
  float fVar44;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar45 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar106;
  float fVar110;
  float fVar111;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Mat m;
  Mat m_1;
  float tmp [6] [8] [8];
  Allocator *_allocator;
  int local_8f0;
  uint local_8ec;
  long local_8e8;
  ulong local_8e0;
  ulong local_8d8;
  ulong local_8d0;
  void *local_8c8;
  void *local_8c0;
  _func_int ***local_8b8;
  _func_int ***local_8b0;
  void *local_8a8;
  long local_8a0;
  ulong local_898;
  void *local_890;
  int local_888;
  uint local_884;
  Mat local_880;
  long local_830;
  void *local_828;
  void *local_820;
  Mat *local_818;
  void *local_810;
  long local_808;
  undefined1 *local_800;
  long local_7f8;
  int local_7f0;
  int local_7ec;
  ulong local_7e8;
  ulong local_7e0;
  ulong local_7d8;
  long local_7d0;
  ulong local_7c8;
  Mat local_7c0;
  Mat local_770;
  void *local_720;
  long local_718;
  long local_710;
  long local_708;
  long local_700;
  ulong local_6f8;
  Mat local_6f0;
  ulong local_6a8;
  Mat *local_6a0;
  void *local_698;
  long local_690;
  long local_688;
  long local_680;
  long local_678;
  ulong local_670;
  Mat *local_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float afStack_64c [3];
  Allocator *local_640;
  int iStack_638;
  int iStack_634;
  int iStack_630;
  float fStack_62c;
  int iStack_628;
  float fStack_624;
  size_t local_620 [4];
  float local_600 [8];
  undefined8 local_5e0 [4];
  float local_5c0 [8];
  float local_5a0 [8];
  float local_580 [8];
  undefined8 auStack_560 [8];
  undefined8 auStack_520 [8];
  undefined8 auStack_4e0 [16];
  undefined1 auStack_460 [128];
  undefined1 auStack_3e0 [128];
  undefined1 auStack_360 [256];
  undefined1 auStack_260 [256];
  undefined1 auStack_160 [256];
  undefined1 auStack_60 [48];
  undefined1 auVar65 [32];
  undefined1 auVar75 [32];
  undefined1 auVar79 [32];
  undefined1 auVar86 [32];
  
  uVar41 = top_blob->elempack * top_blob->c;
  uVar43 = ((top_blob->h + 5) / 6) * ((top_blob->w + 5) / 6);
  uVar40 = bottom_blob->elempack * bottom_blob->c;
  local_818 = top_blob;
  local_6a0 = bias;
  local_668 = AT;
  get_optimal_tile_mnk(uVar41,uVar43,uVar40,(int *)&local_884,(int *)&local_8ec,&local_8f0,nT);
  local_7f0 = (int)(uVar41 + local_884 + -1) / (int)local_884;
  iVar39 = (int)(uVar43 + local_8ec + -1) / (int)local_8ec;
  iVar42 = (int)(local_8f0 + uVar40 + -1) / local_8f0;
  iVar27 = local_8f0 * local_8ec;
  _allocator = opt->workspace_allocator;
  local_770.cstep = 0;
  local_770.data = (void *)0x0;
  local_770.refcount._0_4_ = 0;
  local_770.refcount._4_4_ = 0;
  local_770.elemsize._0_4_ = 0;
  local_770.elemsize._4_4_ = 0;
  local_770.elempack = 0;
  local_770.allocator = (Allocator *)0x0;
  local_770.dims = 0;
  local_770.w = 0;
  local_770.h = 0;
  local_770.d = 0;
  local_770.c = 0;
  local_7e8 = (ulong)uVar43;
  local_7e0 = (ulong)uVar40;
  local_6a8 = (ulong)uVar41;
  Mat::create(&local_770,iVar27,0x40,iVar42,iVar39,4,_allocator);
  iVar39 = iVar42 * iVar39;
  iVar27 = iVar27 * 0x40;
  if ((nT < 2) || (nT <= iVar39)) {
    local_620[0] = 0;
    local_660 = (undefined1  [8])0x0;
    fStack_658 = 0.0;
    fStack_654 = 0.0;
    fStack_650 = 0.0;
    afStack_64c[0] = 0.0;
    afStack_64c[1] = 0.0;
    local_640 = (Allocator *)0x0;
    iStack_638 = 0;
    iStack_634 = 0;
    iStack_630 = 0;
    fStack_62c = 0.0;
    iStack_628 = 0;
    Mat::create((Mat *)local_660,iVar27,1,nT,4,opt->workspace_allocator);
    if (0 < iVar39) {
      iVar27 = 0;
      do {
        iVar35 = local_8ec * (iVar27 / iVar42);
        iVar24 = local_8f0 * (iVar27 % iVar42);
        uVar40 = (int)local_7e8 - iVar35;
        if ((int)local_8ec < (int)uVar40) {
          uVar40 = local_8ec;
        }
        iVar28 = (int)local_7e0 - iVar24;
        if (local_8f0 < iVar28) {
          iVar28 = local_8f0;
        }
        iVar13 = get_omp_thread_num();
        uVar33 = CONCAT44(afStack_64c[0],fStack_650);
        local_880.data = (void *)((long)iVar13 * local_620[0] * uVar33 + (long)local_660);
        local_880.refcount._0_4_ = 0;
        local_880.refcount._4_4_ = 0;
        local_880.elemsize._0_4_ = (int)fStack_650;
        local_880.elemsize._4_4_ = (int)afStack_64c[0];
        local_880.elempack = (int)afStack_64c[1];
        local_880.allocator = local_640;
        local_880.w = iStack_634;
        local_880.h = iStack_630;
        local_880.d = 1;
        local_880.c = (int)fStack_62c;
        local_880.dims = iStack_638 + -1;
        local_880.cstep =
             (uVar33 * (long)iStack_630 * (long)iStack_634 + 0xf & 0xfffffffffffffff0) / uVar33;
        if (iStack_638 == 4) {
          local_880.cstep = (long)iStack_630 * (long)iStack_634;
        }
        conv3x3s1_winograd63_transform_input_tile
                  (bottom_blob,&local_880,iVar35,uVar40,iVar24,iVar28,(int)_allocator);
        local_7c0.cstep = (long)local_770.h * (long)local_770.w;
        local_7c0.data =
             (void *)((long)local_770.data +
                     (ulong)(uint)(iVar27 % iVar42) *
                     CONCAT44(local_770.elemsize._4_4_,(undefined4)local_770.elemsize) *
                     local_7c0.cstep +
                     (long)(iVar27 / iVar42) * local_770.cstep *
                     CONCAT44(local_770.elemsize._4_4_,(undefined4)local_770.elemsize));
        local_7c0.refcount._0_4_ = 0;
        local_7c0.refcount._4_4_ = 0;
        local_7c0.elemsize._0_4_ = (undefined4)local_770.elemsize;
        local_7c0.elemsize._4_4_ = local_770.elemsize._4_4_;
        local_7c0.elempack = local_770.elempack;
        local_7c0.allocator = local_770.allocator;
        local_7c0.dims = 2;
        local_7c0.w = local_770.w;
        local_7c0.h = local_770.h;
        local_7c0.d = 1;
        local_7c0.c = 1;
        transpose_pack_B_tile(&local_880,&local_7c0,0x40,uVar40,iVar28,(int)local_7c0.cstep);
        piVar11 = (int *)CONCAT44(local_7c0.refcount._4_4_,(int)local_7c0.refcount);
        if (piVar11 != (int *)0x0) {
          LOCK();
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            if (local_7c0.allocator == (Allocator *)0x0) {
              if (local_7c0.data != (void *)0x0) {
                free(local_7c0.data);
              }
            }
            else {
              (*(local_7c0.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_7c0.cstep = 0;
        local_7c0.data = (void *)0x0;
        local_7c0.refcount._0_4_ = 0;
        local_7c0.refcount._4_4_ = 0;
        local_7c0.elemsize._0_4_ = 0;
        local_7c0.elemsize._4_4_ = 0;
        local_7c0.elempack = 0;
        local_7c0.dims = 0;
        local_7c0.w = 0;
        local_7c0.h = 0;
        local_7c0.d = 0;
        local_7c0.c = 0;
        piVar11 = (int *)CONCAT44(local_880.refcount._4_4_,(int)local_880.refcount);
        if (piVar11 != (int *)0x0) {
          LOCK();
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            if (local_880.allocator == (Allocator *)0x0) {
              if (local_880.data != (void *)0x0) {
                free(local_880.data);
              }
            }
            else {
              (*(local_880.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_880.cstep = 0;
        local_880.data = (void *)0x0;
        local_880.refcount._0_4_ = 0;
        local_880.refcount._4_4_ = 0;
        local_880.elemsize._0_4_ = 0;
        local_880.elemsize._4_4_ = 0;
        local_880.elempack = 0;
        local_880.dims = 0;
        local_880.w = 0;
        local_880.h = 0;
        local_880.d = 0;
        local_880.c = 0;
        iVar27 = iVar27 + 1;
      } while (iVar39 != iVar27);
    }
    piVar11 = (int *)CONCAT44(fStack_654,fStack_658);
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_640 == (Allocator *)0x0) {
          if (local_660 != (undefined1  [8])0x0) {
            free((void *)local_660);
          }
        }
        else {
          (*local_640->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    local_620[0] = 0;
    local_660 = (undefined1  [8])0x0;
    fStack_658 = 0.0;
    fStack_654 = 0.0;
    fStack_650 = 0.0;
    afStack_64c[0] = 0.0;
    afStack_64c[1] = 0.0;
    local_640 = (Allocator *)0x0;
    iStack_638 = 0;
    iStack_634 = 0;
    iStack_630 = 0;
    fStack_62c = 0.0;
    iStack_628 = 0;
    Mat::create((Mat *)local_660,iVar27,4,opt->workspace_allocator);
    if (0 < iVar39) {
      iVar27 = 0;
      do {
        iVar24 = local_8ec * (iVar27 / iVar42);
        iVar35 = local_8f0 * (iVar27 % iVar42);
        uVar40 = (int)local_7e8 - iVar24;
        if ((int)local_8ec < (int)uVar40) {
          uVar40 = local_8ec;
        }
        iVar28 = (int)local_7e0 - iVar35;
        if (local_8f0 < iVar28) {
          iVar28 = local_8f0;
        }
        conv3x3s1_winograd63_transform_input_tile
                  (bottom_blob,(Mat *)local_660,iVar24,uVar40,iVar35,iVar28,(int)_allocator);
        local_880.cstep = (long)local_770.h * (long)local_770.w;
        local_880.data =
             (void *)((long)local_770.data +
                     (ulong)(uint)(iVar27 % iVar42) *
                     CONCAT44(local_770.elemsize._4_4_,(undefined4)local_770.elemsize) *
                     local_880.cstep +
                     (long)(iVar27 / iVar42) * local_770.cstep *
                     CONCAT44(local_770.elemsize._4_4_,(undefined4)local_770.elemsize));
        local_880.refcount._0_4_ = 0;
        local_880.refcount._4_4_ = 0;
        local_880.elemsize._0_4_ = (undefined4)local_770.elemsize;
        local_880.elemsize._4_4_ = local_770.elemsize._4_4_;
        local_880.elempack = local_770.elempack;
        local_880.allocator = local_770.allocator;
        local_880.dims = 2;
        local_880.w = local_770.w;
        local_880.h = local_770.h;
        local_880.d = 1;
        local_880.c = 1;
        transpose_pack_B_tile((Mat *)local_660,&local_880,0x40,uVar40,iVar28,(int)local_880.cstep);
        piVar11 = (int *)CONCAT44(local_880.refcount._4_4_,(int)local_880.refcount);
        if (piVar11 != (int *)0x0) {
          LOCK();
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            if (local_880.allocator == (Allocator *)0x0) {
              if (local_880.data != (void *)0x0) {
                free(local_880.data);
              }
            }
            else {
              (*(local_880.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_880.cstep = 0;
        local_880.data = (void *)0x0;
        local_880.refcount._0_4_ = 0;
        local_880.refcount._4_4_ = 0;
        local_880.elemsize._0_4_ = 0;
        local_880.elemsize._4_4_ = 0;
        local_880.elempack = 0;
        local_880.dims = 0;
        local_880.w = 0;
        local_880.h = 0;
        local_880.d = 0;
        local_880.c = 0;
        iVar27 = iVar27 + 1;
      } while (iVar39 != iVar27);
    }
    piVar11 = (int *)CONCAT44(fStack_654,fStack_658);
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_640 == (Allocator *)0x0) {
          if (local_660 != (undefined1  [8])0x0) {
            free((void *)local_660);
          }
        }
        else {
          (*local_640->_vptr_Allocator[3])();
        }
      }
    }
  }
  afStack_64c[1] = 0.0;
  fStack_658 = 0.0;
  fStack_650 = 0.0;
  fStack_654 = 0.0;
  local_660 = (undefined1  [8])0x0;
  local_620[0] = 0;
  local_880.refcount._4_4_ = 0;
  local_880.elemsize._0_4_ = 0;
  local_880.refcount._0_4_ = 0;
  local_880.elempack = 0;
  iStack_628 = 0;
  local_880.cstep = 0;
  local_880.data = (Allocator *)0x0;
  local_880.elemsize._4_4_ = (int)local_880.refcount;
  local_880.allocator = (Allocator *)local_880.data;
  local_880.dims = (int)local_880.refcount;
  local_880.w = local_880.refcount._4_4_;
  local_880.h = (int)local_880.elemsize;
  local_880.d = (int)local_880.refcount;
  local_880.c = local_880.elempack;
  afStack_64c[0] = fStack_658;
  iStack_638 = local_880.refcount._4_4_;
  iStack_634 = (int)local_880.elemsize;
  iStack_630 = (int)local_880.refcount;
  fStack_62c = (float)local_880.elempack;
  Mat::create(&local_880,local_8ec * local_884 * 0x40,1,nT,4,opt->workspace_allocator);
  if (0 < local_7f0) {
    local_888 = 0;
    do {
      uVar40 = local_884;
      iVar27 = get_omp_thread_num();
      uVar33 = CONCAT44(local_880.elemsize._4_4_,(int)local_880.elemsize);
      local_7c0.data =
           (void *)((long)(_func_int ***)local_880.data + (long)iVar27 * local_880.cstep * uVar33);
      local_7c0.refcount._0_4_ = 0;
      local_7c0.refcount._4_4_ = 0;
      local_7c0.elemsize._0_4_ = (int)local_880.elemsize;
      local_7c0.elemsize._4_4_ = local_880.elemsize._4_4_;
      local_7c0.elempack = local_880.elempack;
      local_7c0.allocator = local_880.allocator;
      local_7c0.w = local_880.w;
      local_7c0.h = local_880.h;
      local_7c0.d = 1;
      local_7c0.c = local_880.d;
      local_7c0.dims = local_880.dims + -1;
      local_7c0.cstep =
           (uVar33 * (long)local_880.h * (long)local_880.w + 0xf & 0xfffffffffffffff0) / uVar33;
      if (local_880.dims == 4) {
        local_7c0.cstep = (long)local_880.h * (long)local_880.w;
      }
      uVar43 = uVar40 * local_888;
      local_7d8 = (ulong)uVar43;
      uVar41 = (int)local_6a8 - uVar43;
      if ((int)uVar40 < (int)uVar41) {
        uVar41 = uVar40;
      }
      if (0 < (int)local_7e8) {
        local_830 = (long)(int)uVar43;
        local_670 = (ulong)uVar41;
        local_700 = (long)(int)uVar41;
        uVar33 = 0;
        do {
          uVar40 = (int)local_7e8 - (int)uVar33;
          if ((int)local_8ec < (int)uVar40) {
            uVar40 = local_8ec;
          }
          local_8d8 = (ulong)uVar40;
          local_898 = uVar33;
          if (0 < (int)local_7e0) {
            iVar27 = 0;
            do {
              iVar39 = (int)local_7e0 - iVar27;
              if (local_8f0 < iVar39) {
                iVar39 = local_8f0;
              }
              iStack_634 = local_668->w;
              iStack_630 = local_668->h;
              sVar4 = local_668->elemsize;
              afStack_64c[1] = (float)local_668->elempack;
              local_640 = local_668->allocator;
              local_620[0] = (long)iStack_630 * (long)iStack_634;
              local_660 = (undefined1  [8])
                          ((long)local_668->data +
                          sVar4 * local_620[0] * (long)(iVar27 / local_8f0) +
                          (long)(int)((long)((ulong)(uint)((int)local_7d8 >> 0x1f) << 0x20 |
                                            local_7d8 & 0xffffffff) / (long)(int)local_884) *
                          local_668->cstep * sVar4);
              fStack_658 = 0.0;
              fStack_654 = 0.0;
              fStack_650 = (float)sVar4;
              afStack_64c[0] = (float)(sVar4 >> 0x20);
              iStack_638 = 2;
              fStack_62c = 1.4013e-45;
              iStack_628 = 1;
              local_6f0.cstep = (long)local_770.h * (long)local_770.w;
              local_6f0.data =
                   (void *)((long)local_770.data +
                           CONCAT44(local_770.elemsize._4_4_,(undefined4)local_770.elemsize) *
                           local_6f0.cstep * (long)(iVar27 / local_8f0) +
                           (long)(int)((long)((ulong)(uint)((int)local_898 >> 0x1f) << 0x20 |
                                             local_898 & 0xffffffff) / (long)(int)local_8ec) *
                           local_770.cstep *
                           CONCAT44(local_770.elemsize._4_4_,(undefined4)local_770.elemsize));
              local_6f0.refcount._0_4_ = 0;
              local_6f0.refcount._4_4_ = 0;
              local_6f0.elemsize._0_4_ = (undefined4)local_770.elemsize;
              local_6f0.elemsize._4_4_ = local_770.elemsize._4_4_;
              local_6f0.elempack = local_770.elempack;
              local_6f0.allocator = local_770.allocator;
              local_6f0.w = local_770.w;
              local_6f0.dims = 2;
              local_6f0.h = local_770.h;
              local_6f0.d = 1;
              local_6f0.c = 1;
              gemm_transB_packed_tile
                        ((Mat *)local_660,&local_6f0,&local_7c0,0x40,uVar41,(int)local_8d8,iVar27,
                         iVar39);
              piVar11 = (int *)CONCAT44(local_6f0.refcount._4_4_,local_6f0.refcount._0_4_);
              if (piVar11 != (int *)0x0) {
                LOCK();
                *piVar11 = *piVar11 + -1;
                UNLOCK();
                if (*piVar11 == 0) {
                  if (local_6f0.allocator == (Allocator *)0x0) {
                    if (local_6f0.data != (void *)0x0) {
                      free(local_6f0.data);
                    }
                  }
                  else {
                    (*(local_6f0.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_6f0.cstep = 0;
              local_6f0.data = (void *)0x0;
              local_6f0.refcount._0_4_ = 0;
              local_6f0.refcount._4_4_ = 0;
              local_6f0.elemsize._0_4_ = 0;
              local_6f0.elemsize._4_4_ = 0;
              local_6f0.elempack = 0;
              local_6f0.dims = 0;
              local_6f0.w = 0;
              local_6f0.h = 0;
              local_6f0.d = 0;
              local_6f0.c = 0;
              piVar11 = (int *)CONCAT44(fStack_654,fStack_658);
              if (piVar11 != (int *)0x0) {
                LOCK();
                *piVar11 = *piVar11 + -1;
                UNLOCK();
                if (*piVar11 == 0) {
                  if (local_640 == (Allocator *)0x0) {
                    if (local_660 != (undefined1  [8])0x0) {
                      free((void *)local_660);
                    }
                  }
                  else {
                    (*local_640->_vptr_Allocator[3])();
                  }
                }
              }
              local_620[0] = 0;
              auVar46 = ZEXT816(0);
              auVar45 = auVar46 << 0x40;
              local_660 = auVar45._0_8_;
              local_660 = (undefined1  [8])0x0;
              fStack_658 = auVar46._0_4_;
              fStack_658 = 0.0;
              fStack_654 = auVar45._0_4_;
              fStack_654 = 0.0;
              fStack_650 = auVar45._4_4_;
              fStack_650 = 0.0;
              afStack_64c[1] = auVar46._4_4_;
              afStack_64c[1] = 0.0;
              iStack_628 = 0;
              iVar27 = iVar27 + local_8f0;
              afStack_64c[0] = fStack_658;
              iStack_638 = (int)fStack_654;
              iStack_634 = (int)fStack_650;
              iStack_630 = (int)fStack_658;
              fStack_62c = afStack_64c[1];
            } while (iVar27 < (int)local_7e0);
          }
          iVar27 = local_818->w;
          iVar39 = local_818->elempack;
          uVar43 = (int)local_818->cstep * iVar39;
          local_6f8 = (ulong)uVar43;
          uVar40 = (iVar27 + 5) / 6;
          local_7c8 = (ulong)uVar40;
          iVar42 = (int)local_8d8;
          local_7ec = iVar42 * 0x40;
          pvVar23 = (void *)0x0;
          local_7d0 = (long)local_818->h;
          local_8c0 = local_6a0->data;
          iVar24 = (int)local_898;
          if (7 < (int)uVar41) {
            lVar34 = (long)(int)uVar43;
            local_820 = (void *)(long)(int)(uVar43 * 2);
            lVar14 = (long)(int)(uVar43 * 3);
            lVar15 = (long)(int)(uVar43 * 4);
            lVar16 = (long)(int)(uVar43 * 5);
            lVar17 = (long)(int)(uVar43 * 6);
            lVar18 = (long)(int)(uVar43 * 7);
            local_890 = (void *)(long)(iVar39 * iVar27);
            local_708 = CONCAT44(local_708._4_4_,iVar42 * 0x200);
            local_808 = (long)local_7ec * 4;
            local_710 = (long)(iVar42 * 8) * 4;
            local_718 = (long)(iVar42 * 0x10) * 4;
            local_720 = (void *)((long)(iVar42 * 0x18) * 4);
            local_678 = (long)(iVar42 << 5) * 4;
            local_680 = (long)(iVar42 * 0x28) * 4;
            local_688 = (long)(iVar42 * 0x30) * 4;
            local_690 = (long)(iVar42 * 0x38) * 4;
            local_698 = (void *)((long)local_8c0 + local_830 * 4);
            local_810 = (void *)(local_8d8 & 0xffffffff);
            local_8b0 = (_func_int ***)0x0;
            pvVar23 = (void *)0x0;
            do {
              local_828 = pvVar23;
              if (local_8c0 == (void *)0x0) {
                fVar44 = 0.0;
                fVar111 = 0.0;
                fVar106 = 0.0;
                fVar110 = 0.0;
                fVar112 = 0.0;
                fVar113 = 0.0;
                fVar114 = 0.0;
                fVar115 = 0.0;
              }
              else {
                pfVar31 = (float *)((long)local_698 + (long)local_828 * 4);
                fVar106 = *pfVar31;
                fVar110 = pfVar31[1];
                fVar44 = pfVar31[2];
                fVar111 = pfVar31[3];
                fVar112 = pfVar31[4];
                fVar113 = pfVar31[5];
                fVar114 = pfVar31[6];
                fVar115 = pfVar31[7];
              }
              if (0 < iVar42) {
                lVar19 = (long)(int)local_8b0;
                local_7f8 = lVar19 * 4;
                local_800 = (undefined1 *)(local_710 + lVar19 * 4);
                local_8d0 = local_718 + lVar19 * 4;
                local_8e0 = (ulong)(((int)local_7d8 + (int)local_828) / iVar39);
                pvVar23 = (void *)0x0;
                lVar26 = 0;
                do {
                  local_8a0 = lVar26;
                  local_8a8 = pvVar23;
                  iVar35 = iVar24 + (int)local_8a8;
                  lVar26 = (long)local_7c0.data + local_8a0;
                  lVar38 = -0x100;
                  auVar100._8_4_ = 0x42000000;
                  auVar100._0_8_ = 0x4200000042000000;
                  auVar100._12_4_ = 0x42000000;
                  auVar100._16_4_ = 0x42000000;
                  auVar100._20_4_ = 0x42000000;
                  auVar100._24_4_ = 0x42000000;
                  auVar100._28_4_ = 0x42000000;
                  auVar104._8_4_ = 0x40000000;
                  auVar104._0_8_ = 0x4000000040000000;
                  auVar104._12_4_ = 0x40000000;
                  auVar104._16_4_ = 0x40000000;
                  auVar104._20_4_ = 0x40000000;
                  auVar104._24_4_ = 0x40000000;
                  auVar104._28_4_ = 0x40000000;
                  auVar119._8_4_ = 0x41800000;
                  auVar119._0_8_ = 0x4180000041800000;
                  auVar119._12_4_ = 0x41800000;
                  auVar119._16_4_ = 0x41800000;
                  auVar119._20_4_ = 0x41800000;
                  auVar119._24_4_ = 0x41800000;
                  auVar119._28_4_ = 0x41800000;
                  auVar121._8_4_ = 0x40800000;
                  auVar121._0_8_ = 0x4080000040800000;
                  auVar121._12_4_ = 0x40800000;
                  auVar121._16_4_ = 0x40800000;
                  auVar121._20_4_ = 0x40800000;
                  auVar121._24_4_ = 0x40800000;
                  auVar121._28_4_ = 0x40800000;
                  auVar49._8_4_ = 0x41000000;
                  auVar49._0_8_ = 0x4100000041000000;
                  auVar49._12_4_ = 0x41000000;
                  auVar49._16_4_ = 0x41000000;
                  auVar49._20_4_ = 0x41000000;
                  auVar49._24_4_ = 0x41000000;
                  auVar49._28_4_ = 0x41000000;
                  do {
                    auVar50 = *(undefined1 (*) [32])(local_800 + lVar26);
                    auVar54 = *(undefined1 (*) [32])(lVar26 + local_8d0);
                    auVar55 = *(undefined1 (*) [32])((long)local_720 + lVar26 + lVar19 * 4);
                    auVar74 = *(undefined1 (*) [32])(lVar26 + local_678 + lVar19 * 4);
                    auVar85 = *(undefined1 (*) [32])(lVar26 + local_680 + lVar19 * 4);
                    auVar64 = *(undefined1 (*) [32])(lVar26 + local_688 + lVar19 * 4);
                    auVar89._0_4_ = auVar54._0_4_ + auVar50._0_4_;
                    auVar89._4_4_ = auVar54._4_4_ + auVar50._4_4_;
                    auVar89._8_4_ = auVar54._8_4_ + auVar50._8_4_;
                    auVar89._12_4_ = auVar54._12_4_ + auVar50._12_4_;
                    auVar89._16_4_ = auVar54._16_4_ + auVar50._16_4_;
                    auVar89._20_4_ = auVar54._20_4_ + auVar50._20_4_;
                    auVar89._24_4_ = auVar54._24_4_ + auVar50._24_4_;
                    auVar89._28_4_ = auVar54._28_4_ + auVar50._28_4_;
                    auVar50 = vsubps_avx(auVar50,auVar54);
                    auVar63._0_4_ = auVar74._0_4_ + auVar55._0_4_;
                    auVar63._4_4_ = auVar74._4_4_ + auVar55._4_4_;
                    auVar63._8_4_ = auVar74._8_4_ + auVar55._8_4_;
                    auVar63._12_4_ = auVar74._12_4_ + auVar55._12_4_;
                    auVar63._16_4_ = auVar74._16_4_ + auVar55._16_4_;
                    auVar63._20_4_ = auVar74._20_4_ + auVar55._20_4_;
                    auVar63._24_4_ = auVar74._24_4_ + auVar55._24_4_;
                    auVar63._28_4_ = auVar74._28_4_ + auVar55._28_4_;
                    auVar54 = vsubps_avx(auVar55,auVar74);
                    auVar74._0_4_ = auVar64._0_4_ + auVar85._0_4_;
                    auVar74._4_4_ = auVar64._4_4_ + auVar85._4_4_;
                    auVar74._8_4_ = auVar64._8_4_ + auVar85._8_4_;
                    auVar74._12_4_ = auVar64._12_4_ + auVar85._12_4_;
                    auVar74._16_4_ = auVar64._16_4_ + auVar85._16_4_;
                    auVar74._20_4_ = auVar64._20_4_ + auVar85._20_4_;
                    auVar74._24_4_ = auVar64._24_4_ + auVar85._24_4_;
                    auVar74._28_4_ = auVar64._28_4_ + auVar85._28_4_;
                    auVar55 = vsubps_avx(auVar85,auVar64);
                    pfVar31 = (float *)(lVar26 + local_7f8);
                    auVar46 = vfmadd213ps_fma(auVar100,auVar74,auVar63);
                    auVar85._0_4_ = auVar46._0_4_ + auVar89._0_4_ + *pfVar31;
                    auVar85._4_4_ = auVar46._4_4_ + auVar89._4_4_ + pfVar31[1];
                    auVar85._8_4_ = auVar46._8_4_ + auVar89._8_4_ + pfVar31[2];
                    auVar85._12_4_ = auVar46._12_4_ + auVar89._12_4_ + pfVar31[3];
                    auVar85._16_4_ = auVar89._16_4_ + pfVar31[4] + 0.0;
                    auVar85._20_4_ = auVar89._20_4_ + pfVar31[5] + 0.0;
                    auVar85._24_4_ = auVar89._24_4_ + pfVar31[6] + 0.0;
                    auVar85._28_4_ = auVar89._28_4_ + pfVar31[7] + 0.0;
                    auVar46 = vfmadd213ps_fma(auVar104,auVar54,auVar50);
                    auVar45 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar55,auVar119);
                    auVar46 = vfmadd213ps_fma(auVar121,auVar63,auVar89);
                    auVar56 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar74,auVar49);
                    auVar46 = vfmadd213ps_fma(auVar49,auVar54,auVar50);
                    auVar62 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar55,auVar121);
                    auVar46 = vfmadd213ps_fma(auVar63,auVar119,auVar89);
                    auVar68 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar104,auVar74);
                    pfVar31 = (float *)(lVar26 + local_690 + lVar19 * 4);
                    auVar46 = vfmadd213ps_fma(auVar54,auVar100,auVar55);
                    auVar54._0_4_ = auVar50._0_4_ + *pfVar31 + auVar46._0_4_;
                    auVar54._4_4_ = auVar50._4_4_ + pfVar31[1] + auVar46._4_4_;
                    auVar54._8_4_ = auVar50._8_4_ + pfVar31[2] + auVar46._8_4_;
                    auVar54._12_4_ = auVar50._12_4_ + pfVar31[3] + auVar46._12_4_;
                    auVar54._16_4_ = auVar50._16_4_ + pfVar31[4] + 0.0;
                    auVar54._20_4_ = auVar50._20_4_ + pfVar31[5] + 0.0;
                    auVar54._24_4_ = auVar50._24_4_ + pfVar31[6] + 0.0;
                    auVar54._28_4_ = auVar50._28_4_ + pfVar31[7] + 0.0;
                    *(undefined1 (*) [32])((long)auStack_560 + lVar38) = auVar85;
                    *(undefined1 (*) [32])(auStack_460 + lVar38) = ZEXT1632(auVar45);
                    *(undefined1 (*) [32])(auStack_360 + lVar38) = ZEXT1632(auVar56);
                    *(undefined1 (*) [32])(auStack_260 + lVar38) = ZEXT1632(auVar62);
                    *(undefined1 (*) [32])(auStack_160 + lVar38) = ZEXT1632(auVar68);
                    *(undefined1 (*) [32])(auStack_60 + lVar38) = auVar54;
                    lVar26 = lVar26 + local_808;
                    lVar38 = lVar38 + 0x20;
                  } while (lVar38 != 0);
                  iVar25 = iVar35 % (int)uVar40;
                  lVar26 = (long)((iVar35 / (int)uVar40) * 6);
                  pauVar20 = (undefined1 (*) [32])
                             ((long)local_818->data +
                             (long)(iVar25 * 6 * iVar39) * 4 +
                             (long)local_818->w * local_818->elemsize * lVar26 +
                             local_818->cstep * local_8e0 * local_818->elemsize);
                  iVar36 = iVar25 * 6 + 1;
                  iVar35 = iVar25 * 6 + 2;
                  iVar28 = iVar25 * 6 + 3;
                  local_8c8 = (void *)CONCAT44(local_8c8._4_4_,iVar28);
                  iVar13 = iVar25 * 6 + 4;
                  local_8e8 = CONCAT44(local_8e8._4_4_,iVar13);
                  iVar25 = iVar25 * 6 + 5;
                  local_8b8 = (_func_int ***)CONCAT44(local_8b8._4_4_,iVar25);
                  pfVar31 = local_580;
                  lVar38 = 0;
                  do {
                    if (lVar38 < local_7d0 - lVar26) {
                      auVar49 = *(undefined1 (*) [32])(pfVar31 + -0x30);
                      auVar100 = *(undefined1 (*) [32])(pfVar31 + -0x28);
                      auVar104 = *(undefined1 (*) [32])(pfVar31 + -0x20);
                      auVar119 = *(undefined1 (*) [32])(pfVar31 + -0x18);
                      auVar121 = *(undefined1 (*) [32])(pfVar31 + -0x10);
                      auVar50 = *(undefined1 (*) [32])(pfVar31 + -8);
                      auVar92._0_4_ = auVar100._0_4_ + auVar49._0_4_;
                      auVar92._4_4_ = auVar100._4_4_ + auVar49._4_4_;
                      auVar92._8_4_ = auVar100._8_4_ + auVar49._8_4_;
                      auVar92._12_4_ = auVar100._12_4_ + auVar49._12_4_;
                      auVar92._16_4_ = auVar100._16_4_ + auVar49._16_4_;
                      auVar92._20_4_ = auVar100._20_4_ + auVar49._20_4_;
                      auVar92._24_4_ = auVar100._24_4_ + auVar49._24_4_;
                      auVar92._28_4_ = auVar100._28_4_ + auVar49._28_4_;
                      auVar49 = vsubps_avx(auVar49,auVar100);
                      auVar64._0_4_ = auVar119._0_4_ + auVar104._0_4_;
                      auVar64._4_4_ = auVar119._4_4_ + auVar104._4_4_;
                      auVar64._8_4_ = auVar119._8_4_ + auVar104._8_4_;
                      auVar64._12_4_ = auVar119._12_4_ + auVar104._12_4_;
                      auVar64._16_4_ = auVar119._16_4_ + auVar104._16_4_;
                      auVar64._20_4_ = auVar119._20_4_ + auVar104._20_4_;
                      auVar64._24_4_ = auVar119._24_4_ + auVar104._24_4_;
                      auVar64._28_4_ = auVar119._28_4_ + auVar104._28_4_;
                      auVar100 = vsubps_avx(auVar104,auVar119);
                      auVar96._0_4_ = auVar50._0_4_ + auVar121._0_4_;
                      auVar96._4_4_ = auVar50._4_4_ + auVar121._4_4_;
                      auVar96._8_4_ = auVar50._8_4_ + auVar121._8_4_;
                      auVar96._12_4_ = auVar50._12_4_ + auVar121._12_4_;
                      auVar96._16_4_ = auVar50._16_4_ + auVar121._16_4_;
                      auVar96._20_4_ = auVar50._20_4_ + auVar121._20_4_;
                      auVar96._24_4_ = auVar50._24_4_ + auVar121._24_4_;
                      auVar96._28_4_ = auVar50._28_4_ + auVar121._28_4_;
                      auVar104 = vsubps_avx(auVar121,auVar50);
                      auVar101._8_4_ = 0x42000000;
                      auVar101._0_8_ = 0x4200000042000000;
                      auVar101._12_4_ = 0x42000000;
                      auVar101._16_4_ = 0x42000000;
                      auVar101._20_4_ = 0x42000000;
                      auVar101._24_4_ = 0x42000000;
                      auVar101._28_4_ = 0x42000000;
                      auVar46 = vfmadd213ps_fma(auVar101,auVar96,auVar64);
                      auVar81._0_4_ = auVar92._0_4_ + fVar106 + pfVar31[-0x38] + auVar46._0_4_;
                      auVar81._4_4_ = auVar92._4_4_ + fVar110 + pfVar31[-0x37] + auVar46._4_4_;
                      auVar81._8_4_ = auVar92._8_4_ + fVar44 + pfVar31[-0x36] + auVar46._8_4_;
                      auVar81._12_4_ = auVar92._12_4_ + fVar111 + pfVar31[-0x35] + auVar46._12_4_;
                      auVar86._16_4_ = auVar92._16_4_ + fVar112 + pfVar31[-0x34] + 0.0;
                      auVar86._0_16_ = auVar81;
                      auVar86._20_4_ = auVar92._20_4_ + fVar113 + pfVar31[-0x33] + 0.0;
                      auVar86._24_4_ = auVar92._24_4_ + fVar114 + pfVar31[-0x32] + 0.0;
                      auVar86._28_4_ = auVar92._28_4_ + fVar115 + pfVar31[-0x31] + 0.0;
                      auVar105._8_4_ = 0x40000000;
                      auVar105._0_8_ = 0x4000000040000000;
                      auVar105._12_4_ = 0x40000000;
                      auVar105._16_4_ = 0x40000000;
                      auVar105._20_4_ = 0x40000000;
                      auVar105._24_4_ = 0x40000000;
                      auVar105._28_4_ = 0x40000000;
                      auVar46 = vfmadd213ps_fma(auVar105,auVar100,auVar49);
                      auVar120._8_4_ = 0x41800000;
                      auVar120._0_8_ = 0x4180000041800000;
                      auVar120._12_4_ = 0x41800000;
                      auVar120._16_4_ = 0x41800000;
                      auVar120._20_4_ = 0x41800000;
                      auVar120._24_4_ = 0x41800000;
                      auVar120._28_4_ = 0x41800000;
                      auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar104,auVar120);
                      auVar76._0_4_ = fVar106 + auVar46._0_4_;
                      auVar76._4_4_ = fVar110 + auVar46._4_4_;
                      auVar76._8_4_ = fVar44 + auVar46._8_4_;
                      auVar76._12_4_ = fVar111 + auVar46._12_4_;
                      auVar79._16_4_ = fVar112 + 0.0;
                      auVar79._0_16_ = auVar76;
                      auVar79._20_4_ = fVar113 + 0.0;
                      auVar79._24_4_ = fVar114 + 0.0;
                      auVar79._28_4_ = fVar115 + 0.0;
                      auVar122._8_4_ = 0x40800000;
                      auVar122._0_8_ = 0x4080000040800000;
                      auVar122._12_4_ = 0x40800000;
                      auVar122._16_4_ = 0x40800000;
                      auVar122._20_4_ = 0x40800000;
                      auVar122._24_4_ = 0x40800000;
                      auVar122._28_4_ = 0x40800000;
                      auVar46 = vfmadd213ps_fma(auVar122,auVar64,auVar92);
                      auVar50._8_4_ = 0x41000000;
                      auVar50._0_8_ = 0x4100000041000000;
                      auVar50._12_4_ = 0x41000000;
                      auVar50._16_4_ = 0x41000000;
                      auVar50._20_4_ = 0x41000000;
                      auVar50._24_4_ = 0x41000000;
                      auVar50._28_4_ = 0x41000000;
                      auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar96,auVar50);
                      auVar70._0_4_ = fVar106 + auVar46._0_4_;
                      auVar70._4_4_ = fVar110 + auVar46._4_4_;
                      auVar70._8_4_ = fVar44 + auVar46._8_4_;
                      auVar70._12_4_ = fVar111 + auVar46._12_4_;
                      auVar75._16_4_ = fVar112 + 0.0;
                      auVar75._0_16_ = auVar70;
                      auVar75._20_4_ = fVar113 + 0.0;
                      auVar75._24_4_ = fVar114 + 0.0;
                      auVar75._28_4_ = fVar115 + 0.0;
                      auVar46 = vfmadd213ps_fma(auVar50,auVar100,auVar49);
                      auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar104,auVar122);
                      auVar68._0_4_ = fVar106 + auVar46._0_4_;
                      auVar68._4_4_ = fVar110 + auVar46._4_4_;
                      auVar68._8_4_ = fVar44 + auVar46._8_4_;
                      auVar68._12_4_ = fVar111 + auVar46._12_4_;
                      auVar69._16_4_ = fVar112 + 0.0;
                      auVar69._0_16_ = auVar68;
                      auVar69._20_4_ = fVar113 + 0.0;
                      auVar69._24_4_ = fVar114 + 0.0;
                      auVar69._28_4_ = fVar115 + 0.0;
                      auVar46 = vfmadd213ps_fma(auVar64,auVar120,auVar92);
                      auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar105,auVar96);
                      auVar56._0_4_ = fVar106 + auVar46._0_4_;
                      auVar56._4_4_ = fVar110 + auVar46._4_4_;
                      auVar56._8_4_ = fVar44 + auVar46._8_4_;
                      auVar56._12_4_ = fVar111 + auVar46._12_4_;
                      auVar65._16_4_ = fVar112 + 0.0;
                      auVar65._0_16_ = auVar56;
                      auVar65._20_4_ = fVar113 + 0.0;
                      auVar65._24_4_ = fVar114 + 0.0;
                      auVar65._28_4_ = fVar115 + 0.0;
                      auVar46 = vfmadd213ps_fma(auVar100,auVar101,auVar104);
                      auVar45._0_4_ = fVar106 + auVar49._0_4_ + *pfVar31 + auVar46._0_4_;
                      auVar45._4_4_ = fVar110 + auVar49._4_4_ + pfVar31[1] + auVar46._4_4_;
                      auVar45._8_4_ = fVar44 + auVar49._8_4_ + pfVar31[2] + auVar46._8_4_;
                      auVar45._12_4_ = fVar111 + auVar49._12_4_ + pfVar31[3] + auVar46._12_4_;
                      auVar55._16_4_ = fVar112 + auVar49._16_4_ + pfVar31[4] + 0.0;
                      auVar55._0_16_ = auVar45;
                      auVar55._20_4_ = fVar113 + auVar49._20_4_ + pfVar31[5] + 0.0;
                      auVar55._24_4_ = fVar114 + auVar49._24_4_ + pfVar31[6] + 0.0;
                      auVar55._28_4_ = fVar115 + auVar49._28_4_ + pfVar31[7] + 0.0;
                      auVar47 = auVar86._16_16_;
                      auVar116 = auVar79._16_16_;
                      auVar107 = auVar75._16_16_;
                      auVar95 = auVar69._16_16_;
                      auVar62 = auVar65._16_16_;
                      auVar46 = auVar55._16_16_;
                      if (iVar39 == 1) {
                        *(float *)*pauVar20 = auVar81._0_4_;
                        uVar3 = vextractps_avx(auVar81,1);
                        *(undefined4 *)(*pauVar20 + lVar34 * 4) = uVar3;
                        uVar3 = vextractps_avx(auVar81,2);
                        *(undefined4 *)(*pauVar20 + (long)local_820 * 4) = uVar3;
                        uVar3 = vextractps_avx(auVar81,3);
                        *(undefined4 *)(*pauVar20 + lVar14 * 4) = uVar3;
                        *(float *)(*pauVar20 + lVar15 * 4) = auVar86._16_4_;
                        uVar3 = vextractps_avx(auVar47,1);
                        *(undefined4 *)(*pauVar20 + lVar16 * 4) = uVar3;
                        uVar3 = vextractps_avx(auVar47,2);
                        *(undefined4 *)(*pauVar20 + lVar17 * 4) = uVar3;
                        uVar3 = vextractps_avx(auVar47,3);
                        *(undefined4 *)(*pauVar20 + lVar18 * 4) = uVar3;
                        if (iVar36 < iVar27) {
                          *(float *)(*pauVar20 + 4) = auVar76._0_4_;
                          uVar3 = vextractps_avx(auVar76,1);
                          *(undefined4 *)(*pauVar20 + lVar34 * 4 + 4) = uVar3;
                          uVar3 = vextractps_avx(auVar76,2);
                          *(undefined4 *)(*pauVar20 + (long)local_820 * 4 + 4) = uVar3;
                          uVar3 = vextractps_avx(auVar76,3);
                          *(undefined4 *)(*pauVar20 + lVar14 * 4 + 4) = uVar3;
                          *(float *)(*pauVar20 + lVar15 * 4 + 4) = auVar79._16_4_;
                          uVar3 = vextractps_avx(auVar116,1);
                          *(undefined4 *)(*pauVar20 + lVar16 * 4 + 4) = uVar3;
                          uVar3 = vextractps_avx(auVar116,2);
                          *(undefined4 *)(*pauVar20 + lVar17 * 4 + 4) = uVar3;
                          uVar3 = vextractps_avx(auVar116,3);
                          *(undefined4 *)(*pauVar20 + lVar18 * 4 + 4) = uVar3;
                        }
                        if (iVar35 < iVar27) {
                          *(float *)(*pauVar20 + 8) = auVar70._0_4_;
                          uVar3 = vextractps_avx(auVar70,1);
                          *(undefined4 *)(*pauVar20 + lVar34 * 4 + 8) = uVar3;
                          uVar3 = vextractps_avx(auVar70,2);
                          *(undefined4 *)(*pauVar20 + (long)local_820 * 4 + 8) = uVar3;
                          uVar3 = vextractps_avx(auVar70,3);
                          *(undefined4 *)(*pauVar20 + lVar14 * 4 + 8) = uVar3;
                          *(float *)(*pauVar20 + lVar15 * 4 + 8) = auVar75._16_4_;
                          uVar3 = vextractps_avx(auVar107,1);
                          *(undefined4 *)(*pauVar20 + lVar16 * 4 + 8) = uVar3;
                          uVar3 = vextractps_avx(auVar107,2);
                          *(undefined4 *)(*pauVar20 + lVar17 * 4 + 8) = uVar3;
                          uVar3 = vextractps_avx(auVar107,3);
                          *(undefined4 *)(*pauVar20 + lVar18 * 4 + 8) = uVar3;
                        }
                        if (iVar28 < iVar27) {
                          *(float *)(*pauVar20 + 0xc) = auVar68._0_4_;
                          uVar3 = vextractps_avx(auVar68,1);
                          *(undefined4 *)(*pauVar20 + lVar34 * 4 + 0xc) = uVar3;
                          uVar3 = vextractps_avx(auVar68,2);
                          *(undefined4 *)(*pauVar20 + (long)local_820 * 4 + 0xc) = uVar3;
                          uVar3 = vextractps_avx(auVar68,3);
                          *(undefined4 *)(*pauVar20 + lVar14 * 4 + 0xc) = uVar3;
                          *(float *)(*pauVar20 + lVar15 * 4 + 0xc) = auVar69._16_4_;
                          uVar3 = vextractps_avx(auVar95,1);
                          *(undefined4 *)(*pauVar20 + lVar16 * 4 + 0xc) = uVar3;
                          uVar3 = vextractps_avx(auVar95,2);
                          *(undefined4 *)(*pauVar20 + lVar17 * 4 + 0xc) = uVar3;
                          uVar3 = vextractps_avx(auVar95,3);
                          *(undefined4 *)(*pauVar20 + lVar18 * 4 + 0xc) = uVar3;
                        }
                        if (iVar13 < iVar27) {
                          *(float *)(*pauVar20 + 0x10) = auVar56._0_4_;
                          uVar3 = vextractps_avx(auVar56,1);
                          *(undefined4 *)(*pauVar20 + lVar34 * 4 + 0x10) = uVar3;
                          uVar3 = vextractps_avx(auVar56,2);
                          *(undefined4 *)(*pauVar20 + (long)local_820 * 4 + 0x10) = uVar3;
                          uVar3 = vextractps_avx(auVar56,3);
                          *(undefined4 *)(*pauVar20 + lVar14 * 4 + 0x10) = uVar3;
                          *(float *)(*pauVar20 + lVar15 * 4 + 0x10) = auVar65._16_4_;
                          uVar3 = vextractps_avx(auVar62,1);
                          *(undefined4 *)(*pauVar20 + lVar16 * 4 + 0x10) = uVar3;
                          uVar3 = vextractps_avx(auVar62,2);
                          *(undefined4 *)(*pauVar20 + lVar17 * 4 + 0x10) = uVar3;
                          uVar3 = vextractps_avx(auVar62,3);
                          *(undefined4 *)(*pauVar20 + lVar18 * 4 + 0x10) = uVar3;
                        }
                        if (iVar25 < iVar27) {
                          *(float *)(*pauVar20 + 0x14) = auVar45._0_4_;
                          uVar3 = vextractps_avx(auVar45,1);
                          *(undefined4 *)(*pauVar20 + lVar34 * 4 + 0x14) = uVar3;
                          uVar3 = vextractps_avx(auVar45,2);
                          *(undefined4 *)(*pauVar20 + (long)local_820 * 4 + 0x14) = uVar3;
                          uVar3 = vextractps_avx(auVar45,3);
                          *(undefined4 *)(*pauVar20 + lVar14 * 4 + 0x14) = uVar3;
                          *(float *)(*pauVar20 + lVar15 * 4 + 0x14) = auVar55._16_4_;
                          uVar3 = vextractps_avx(auVar46,1);
                          *(undefined4 *)(*pauVar20 + lVar16 * 4 + 0x14) = uVar3;
                          uVar3 = vextractps_avx(auVar46,2);
                          *(undefined4 *)(*pauVar20 + lVar17 * 4 + 0x14) = uVar3;
                          uVar3 = vextractps_avx(auVar46,3);
                          *(undefined4 *)(*pauVar20 + lVar18 * 4 + 0x14) = uVar3;
                        }
                      }
                      else if (iVar39 == 4) {
                        *(undefined1 (*) [16])*pauVar20 = auVar81;
                        *(undefined1 (*) [16])(*pauVar20 + lVar34 * 4) = auVar47;
                        if (iVar36 < iVar27) {
                          *(undefined1 (*) [16])(*pauVar20 + 0x10) = auVar76;
                          *(undefined1 (*) [16])(*pauVar20 + lVar34 * 4 + 0x10) = auVar116;
                        }
                        if (iVar35 < iVar27) {
                          *(undefined1 (*) [16])pauVar20[1] = auVar70;
                          *(undefined1 (*) [16])(pauVar20[1] + lVar34 * 4) = auVar107;
                        }
                        if (iVar28 < iVar27) {
                          *(undefined1 (*) [16])(pauVar20[1] + 0x10) = auVar68;
                          *(undefined1 (*) [16])(pauVar20[1] + lVar34 * 4 + 0x10) = auVar95;
                        }
                        if (iVar13 < iVar27) {
                          *(undefined1 (*) [16])pauVar20[2] = auVar56;
                          *(undefined1 (*) [16])(pauVar20[2] + lVar34 * 4) = auVar62;
                        }
                        if (iVar25 < iVar27) {
                          *(undefined1 (*) [16])(pauVar20[2] + 0x10) = auVar45;
                          *(undefined1 (*) [16])(pauVar20[2] + lVar34 * 4 + 0x10) = auVar46;
                        }
                      }
                      else if (iVar39 == 8) {
                        *pauVar20 = auVar86;
                        if (iVar36 < iVar27) {
                          pauVar20[1] = auVar79;
                        }
                        if (iVar35 < iVar27) {
                          pauVar20[2] = auVar75;
                        }
                        if (iVar28 < iVar27) {
                          pauVar20[3] = auVar69;
                        }
                        if (iVar13 < iVar27) {
                          pauVar20[4] = auVar65;
                        }
                        if (iVar25 < iVar27) {
                          pauVar20[5] = auVar55;
                        }
                      }
                      pauVar20 = (undefined1 (*) [32])(*pauVar20 + (long)local_890 * 4);
                    }
                    lVar38 = lVar38 + 1;
                    pfVar31 = pfVar31 + 0x40;
                  } while (lVar38 != 6);
                  pvVar23 = (void *)((long)local_8a8 + 1U);
                  lVar26 = local_8a0 + 0x20;
                } while ((void *)((long)local_8a8 + 1U) != local_810);
              }
              pvVar23 = (void *)((long)local_828 + 8);
              local_8b0 = (_func_int ***)(ulong)(uint)((int)local_8b0 + iVar42 * 0x200);
            } while ((long)local_828 + 0xfU < local_670);
          }
          if ((int)((uint)pvVar23 | 3) < (int)uVar41) {
            local_7f8 = (long)(int)(uVar43 * 2);
            lVar14 = (long)(int)(uVar43 * 3);
            uVar37 = (uint)pvVar23 * iVar42 * 0x40;
            local_820 = (void *)CONCAT44(local_820._4_4_,iVar42 * 0x100);
            local_8a8 = (void *)((long)(iVar42 << 5) * 4);
            local_808 = (long)(iVar42 * 4) * 4;
            local_810 = (void *)((long)(iVar42 * 8) * 4);
            local_8b0 = (_func_int ***)((long)(iVar42 * 0xc) * 4);
            local_828 = (void *)((long)(iVar42 << 4) * 4);
            local_708 = (long)(iVar42 * 0x14) * 4;
            local_710 = (long)(iVar42 * 0x18) * 4;
            local_718 = (long)(iVar42 * 0x1c) * 4;
            local_720 = (void *)((long)local_8c0 + local_830 * 4);
            lVar15 = (long)(int)uVar43;
            local_800 = (undefined1 *)(local_8d8 & 0xffffffff);
            local_8e0 = (ulong)pvVar23 & 0xffffffff;
            do {
              local_8d0 = (ulong)uVar37;
              if (local_8c0 == (void *)0x0) {
                fVar44 = 0.0;
                fVar111 = 0.0;
                fVar106 = 0.0;
                fVar110 = 0.0;
              }
              else {
                pfVar31 = (float *)((long)local_720 + local_8e0 * 4);
                fVar44 = *pfVar31;
                fVar111 = pfVar31[1];
                fVar106 = pfVar31[2];
                fVar110 = pfVar31[3];
              }
              if (0 < iVar42) {
                lVar17 = (long)(int)uVar37;
                local_890 = (void *)(lVar17 * 4);
                local_8a0 = (long)(((int)local_7d8 + (int)local_8e0) / iVar39);
                lVar16 = 0;
                ppp_Var12 = (_func_int ***)0x0;
                do {
                  local_8b8 = ppp_Var12;
                  local_8e8 = lVar16;
                  iVar35 = iVar24 + (int)local_8b8;
                  lVar16 = (long)local_7c0.data + local_8e8;
                  lVar18 = -0x80;
                  auVar107._8_4_ = 0x42000000;
                  auVar107._0_8_ = 0x4200000042000000;
                  auVar107._12_4_ = 0x42000000;
                  auVar116._8_4_ = 0x40000000;
                  auVar116._0_8_ = 0x4000000040000000;
                  auVar116._12_4_ = 0x40000000;
                  auVar62._8_4_ = 0x41800000;
                  auVar62._0_8_ = 0x4180000041800000;
                  auVar62._12_4_ = 0x41800000;
                  auVar95._8_4_ = 0x40800000;
                  auVar95._0_8_ = 0x4080000040800000;
                  auVar95._12_4_ = 0x40800000;
                  auVar46._8_4_ = 0x41000000;
                  auVar46._0_8_ = 0x4100000041000000;
                  auVar46._12_4_ = 0x41000000;
                  do {
                    auVar45 = *(undefined1 (*) [16])(lVar16 + local_808 + lVar17 * 4);
                    auVar56 = *(undefined1 (*) [16])((long)local_810 + lVar16 + lVar17 * 4);
                    auVar68 = *(undefined1 (*) [16])((long)local_8b0 + lVar16 + lVar17 * 4);
                    auVar70 = *(undefined1 (*) [16])((long)local_828 + lVar16 + lVar17 * 4);
                    auVar76 = *(undefined1 (*) [16])(lVar16 + local_708 + lVar17 * 4);
                    auVar81 = *(undefined1 (*) [16])(lVar16 + local_710 + lVar17 * 4);
                    auVar87._0_4_ = auVar56._0_4_ + auVar45._0_4_;
                    auVar87._4_4_ = auVar56._4_4_ + auVar45._4_4_;
                    auVar87._8_4_ = auVar56._8_4_ + auVar45._8_4_;
                    auVar87._12_4_ = auVar56._12_4_ + auVar45._12_4_;
                    auVar45 = vsubps_avx(auVar45,auVar56);
                    auVar57._0_4_ = auVar70._0_4_ + auVar68._0_4_;
                    auVar57._4_4_ = auVar70._4_4_ + auVar68._4_4_;
                    auVar57._8_4_ = auVar70._8_4_ + auVar68._8_4_;
                    auVar57._12_4_ = auVar70._12_4_ + auVar68._12_4_;
                    auVar56 = vsubps_avx(auVar68,auVar70);
                    auVar71._0_4_ = auVar81._0_4_ + auVar76._0_4_;
                    auVar71._4_4_ = auVar81._4_4_ + auVar76._4_4_;
                    auVar71._8_4_ = auVar81._8_4_ + auVar76._8_4_;
                    auVar71._12_4_ = auVar81._12_4_ + auVar76._12_4_;
                    auVar68 = vsubps_avx(auVar76,auVar81);
                    pfVar31 = (float *)(lVar16 + (long)local_890);
                    auVar70 = vfmadd213ps_fma(auVar107,auVar71,auVar57);
                    auVar82._0_4_ = auVar70._0_4_ + auVar87._0_4_ + *pfVar31;
                    auVar82._4_4_ = auVar70._4_4_ + auVar87._4_4_ + pfVar31[1];
                    auVar82._8_4_ = auVar70._8_4_ + auVar87._8_4_ + pfVar31[2];
                    auVar82._12_4_ = auVar70._12_4_ + auVar87._12_4_ + pfVar31[3];
                    auVar70 = vfmadd213ps_fma(auVar116,auVar56,auVar45);
                    auVar76 = vfmadd231ps_fma(auVar70,auVar68,auVar62);
                    auVar70 = vfmadd213ps_fma(auVar95,auVar57,auVar87);
                    auVar81 = vfmadd231ps_fma(auVar70,auVar71,auVar46);
                    auVar70 = vfmadd213ps_fma(auVar46,auVar56,auVar45);
                    auVar47 = vfmadd231ps_fma(auVar70,auVar68,auVar95);
                    auVar70 = vfmadd213ps_fma(auVar57,auVar62,auVar87);
                    auVar70 = vfmadd231ps_fma(auVar70,auVar116,auVar71);
                    pfVar31 = (float *)(lVar16 + local_718 + lVar17 * 4);
                    auVar56 = vfmadd213ps_fma(auVar56,auVar107,auVar68);
                    auVar51._0_4_ = auVar45._0_4_ + *pfVar31 + auVar56._0_4_;
                    auVar51._4_4_ = auVar45._4_4_ + pfVar31[1] + auVar56._4_4_;
                    auVar51._8_4_ = auVar45._8_4_ + pfVar31[2] + auVar56._8_4_;
                    auVar51._12_4_ = auVar45._12_4_ + pfVar31[3] + auVar56._12_4_;
                    *(undefined1 (*) [16])((long)local_5e0 + lVar18) = auVar82;
                    *(undefined1 (*) [16])((long)auStack_560 + lVar18) = auVar76;
                    *(undefined1 (*) [16])((long)auStack_4e0 + lVar18) = auVar81;
                    *(undefined1 (*) [16])(auStack_460 + lVar18) = auVar47;
                    *(undefined1 (*) [16])(auStack_3e0 + lVar18) = auVar70;
                    *(undefined1 (*) [16])(auStack_360 + lVar18) = auVar51;
                    lVar16 = lVar16 + (long)local_8a8;
                    lVar18 = lVar18 + 0x10;
                  } while (lVar18 != 0);
                  iVar25 = iVar35 % (int)uVar40;
                  lVar16 = (long)((iVar35 / (int)uVar40) * 6);
                  pauVar21 = (undefined1 (*) [16])
                             ((long)local_818->data +
                             (long)(iVar25 * 6 * iVar39) * 4 +
                             (long)local_818->w * local_818->elemsize * lVar16 +
                             local_818->cstep * local_8a0 * local_818->elemsize);
                  iVar36 = iVar25 * 6 + 1;
                  iVar35 = iVar25 * 6 + 2;
                  iVar28 = iVar25 * 6 + 3;
                  iVar13 = iVar25 * 6 + 4;
                  iVar25 = iVar25 * 6 + 5;
                  local_8c8 = (void *)CONCAT44(local_8c8._4_4_,iVar25);
                  pfVar31 = local_600 + 4;
                  lVar18 = 0;
                  do {
                    if (lVar18 < local_7d0 - lVar16) {
                      auVar46 = *(undefined1 (*) [16])(pfVar31 + -0x18);
                      auVar45 = *(undefined1 (*) [16])(pfVar31 + -0x14);
                      auVar56 = *(undefined1 (*) [16])(pfVar31 + -0x10);
                      auVar62 = *(undefined1 (*) [16])(pfVar31 + -0xc);
                      auVar68 = *(undefined1 (*) [16])(pfVar31 + -8);
                      auVar95 = *(undefined1 (*) [16])(pfVar31 + -4);
                      auVar90._0_4_ = auVar45._0_4_ + auVar46._0_4_;
                      auVar90._4_4_ = auVar45._4_4_ + auVar46._4_4_;
                      auVar90._8_4_ = auVar45._8_4_ + auVar46._8_4_;
                      auVar90._12_4_ = auVar45._12_4_ + auVar46._12_4_;
                      auVar46 = vsubps_avx(auVar46,auVar45);
                      auVar58._0_4_ = auVar62._0_4_ + auVar56._0_4_;
                      auVar58._4_4_ = auVar62._4_4_ + auVar56._4_4_;
                      auVar58._8_4_ = auVar62._8_4_ + auVar56._8_4_;
                      auVar58._12_4_ = auVar62._12_4_ + auVar56._12_4_;
                      auVar45 = vsubps_avx(auVar56,auVar62);
                      auVar93._0_4_ = auVar95._0_4_ + auVar68._0_4_;
                      auVar93._4_4_ = auVar95._4_4_ + auVar68._4_4_;
                      auVar93._8_4_ = auVar95._8_4_ + auVar68._8_4_;
                      auVar93._12_4_ = auVar95._12_4_ + auVar68._12_4_;
                      auVar56 = vsubps_avx(auVar68,auVar95);
                      auVar108._8_4_ = 0x42000000;
                      auVar108._0_8_ = 0x4200000042000000;
                      auVar108._12_4_ = 0x42000000;
                      auVar62 = vfmadd213ps_fma(auVar108,auVar93,auVar58);
                      auVar83._0_4_ = auVar90._0_4_ + fVar44 + pfVar31[-0x1c] + auVar62._0_4_;
                      auVar83._4_4_ = auVar90._4_4_ + fVar111 + pfVar31[-0x1b] + auVar62._4_4_;
                      auVar83._8_4_ = auVar90._8_4_ + fVar106 + pfVar31[-0x1a] + auVar62._8_4_;
                      auVar83._12_4_ = auVar90._12_4_ + fVar110 + pfVar31[-0x19] + auVar62._12_4_;
                      auVar117._8_4_ = 0x40000000;
                      auVar117._0_8_ = 0x4000000040000000;
                      auVar117._12_4_ = 0x40000000;
                      auVar62 = vfmadd213ps_fma(auVar117,auVar45,auVar46);
                      auVar98._8_4_ = 0x41800000;
                      auVar98._0_8_ = 0x4180000041800000;
                      auVar98._12_4_ = 0x41800000;
                      auVar62 = vfmadd231ps_fma(auVar62,auVar56,auVar98);
                      auVar77._0_4_ = fVar44 + auVar62._0_4_;
                      auVar77._4_4_ = fVar111 + auVar62._4_4_;
                      auVar77._8_4_ = fVar106 + auVar62._8_4_;
                      auVar77._12_4_ = fVar110 + auVar62._12_4_;
                      auVar102._8_4_ = 0x40800000;
                      auVar102._0_8_ = 0x4080000040800000;
                      auVar102._12_4_ = 0x40800000;
                      auVar62 = vfmadd213ps_fma(auVar102,auVar58,auVar90);
                      auVar47._8_4_ = 0x41000000;
                      auVar47._0_8_ = 0x4100000041000000;
                      auVar47._12_4_ = 0x41000000;
                      auVar62 = vfmadd231ps_fma(auVar62,auVar93,auVar47);
                      auVar72._0_4_ = fVar44 + auVar62._0_4_;
                      auVar72._4_4_ = fVar111 + auVar62._4_4_;
                      auVar72._8_4_ = fVar106 + auVar62._8_4_;
                      auVar72._12_4_ = fVar110 + auVar62._12_4_;
                      auVar62 = vfmadd213ps_fma(auVar47,auVar45,auVar46);
                      auVar62 = vfmadd231ps_fma(auVar62,auVar56,auVar102);
                      auVar66._0_4_ = fVar44 + auVar62._0_4_;
                      auVar66._4_4_ = fVar111 + auVar62._4_4_;
                      auVar66._8_4_ = fVar106 + auVar62._8_4_;
                      auVar66._12_4_ = fVar110 + auVar62._12_4_;
                      auVar62 = vfmadd213ps_fma(auVar58,auVar98,auVar90);
                      auVar62 = vfmadd231ps_fma(auVar62,auVar117,auVar93);
                      auVar59._0_4_ = fVar44 + auVar62._0_4_;
                      auVar59._4_4_ = fVar111 + auVar62._4_4_;
                      auVar59._8_4_ = fVar106 + auVar62._8_4_;
                      auVar59._12_4_ = fVar110 + auVar62._12_4_;
                      auVar45 = vfmadd213ps_fma(auVar45,auVar108,auVar56);
                      auVar52._0_4_ = fVar44 + auVar46._0_4_ + *pfVar31 + auVar45._0_4_;
                      auVar52._4_4_ = fVar111 + auVar46._4_4_ + pfVar31[1] + auVar45._4_4_;
                      auVar52._8_4_ = fVar106 + auVar46._8_4_ + pfVar31[2] + auVar45._8_4_;
                      auVar52._12_4_ = fVar110 + auVar46._12_4_ + pfVar31[3] + auVar45._12_4_;
                      if (iVar39 == 1) {
                        *(float *)*pauVar21 = auVar83._0_4_;
                        uVar3 = vextractps_avx(auVar83,1);
                        *(undefined4 *)(*pauVar21 + lVar15 * 4) = uVar3;
                        uVar3 = vextractps_avx(auVar83,2);
                        *(undefined4 *)(*pauVar21 + local_7f8 * 4) = uVar3;
                        uVar3 = vextractps_avx(auVar83,3);
                        *(undefined4 *)(*pauVar21 + lVar14 * 4) = uVar3;
                        if (iVar36 < iVar27) {
                          *(float *)(*pauVar21 + 4) = auVar77._0_4_;
                          uVar3 = vextractps_avx(auVar77,1);
                          *(undefined4 *)(*pauVar21 + lVar15 * 4 + 4) = uVar3;
                          uVar3 = vextractps_avx(auVar77,2);
                          *(undefined4 *)(*pauVar21 + local_7f8 * 4 + 4) = uVar3;
                          uVar3 = vextractps_avx(auVar77,3);
                          *(undefined4 *)(*pauVar21 + lVar14 * 4 + 4) = uVar3;
                        }
                        if (iVar35 < iVar27) {
                          *(float *)(*pauVar21 + 8) = auVar72._0_4_;
                          uVar3 = vextractps_avx(auVar72,1);
                          *(undefined4 *)(*pauVar21 + lVar15 * 4 + 8) = uVar3;
                          uVar3 = vextractps_avx(auVar72,2);
                          *(undefined4 *)(*pauVar21 + local_7f8 * 4 + 8) = uVar3;
                          uVar3 = vextractps_avx(auVar72,3);
                          *(undefined4 *)(*pauVar21 + lVar14 * 4 + 8) = uVar3;
                        }
                        if (iVar28 < iVar27) {
                          *(float *)(*pauVar21 + 0xc) = auVar66._0_4_;
                          uVar3 = vextractps_avx(auVar66,1);
                          *(undefined4 *)(*pauVar21 + lVar15 * 4 + 0xc) = uVar3;
                          uVar3 = vextractps_avx(auVar66,2);
                          *(undefined4 *)(*pauVar21 + local_7f8 * 4 + 0xc) = uVar3;
                          uVar3 = vextractps_avx(auVar66,3);
                          *(undefined4 *)(*pauVar21 + lVar14 * 4 + 0xc) = uVar3;
                        }
                        if (iVar13 < iVar27) {
                          *(float *)pauVar21[1] = auVar59._0_4_;
                          uVar3 = vextractps_avx(auVar59,1);
                          *(undefined4 *)(pauVar21[1] + lVar15 * 4) = uVar3;
                          uVar3 = vextractps_avx(auVar59,2);
                          *(undefined4 *)(pauVar21[1] + local_7f8 * 4) = uVar3;
                          uVar3 = vextractps_avx(auVar59,3);
                          *(undefined4 *)(pauVar21[1] + lVar14 * 4) = uVar3;
                        }
                        if (iVar25 < iVar27) {
                          *(float *)(pauVar21[1] + 4) = auVar52._0_4_;
                          uVar3 = vextractps_avx(auVar52,1);
                          *(undefined4 *)(pauVar21[1] + lVar15 * 4 + 4) = uVar3;
                          uVar3 = vextractps_avx(auVar52,2);
                          *(undefined4 *)(pauVar21[1] + local_7f8 * 4 + 4) = uVar3;
                          uVar3 = vextractps_avx(auVar52,3);
                          *(undefined4 *)(pauVar21[1] + lVar14 * 4 + 4) = uVar3;
                        }
                      }
                      else if (iVar39 == 4) {
                        *pauVar21 = auVar83;
                        if (iVar36 < iVar27) {
                          pauVar21[1] = auVar77;
                        }
                        if (iVar35 < iVar27) {
                          pauVar21[2] = auVar72;
                        }
                        if (iVar28 < iVar27) {
                          pauVar21[3] = auVar66;
                        }
                        if (iVar13 < iVar27) {
                          pauVar21[4] = auVar59;
                        }
                        if (iVar25 < iVar27) {
                          pauVar21[5] = auVar52;
                        }
                      }
                      pauVar21 = (undefined1 (*) [16])(*pauVar21 + (long)(iVar39 * iVar27) * 4);
                    }
                    lVar18 = lVar18 + 1;
                    pfVar31 = pfVar31 + 0x20;
                  } while (lVar18 != 6);
                  lVar16 = local_8e8 + 0x10;
                  ppp_Var12 = (_func_int ***)((long)local_8b8 + 1U);
                } while ((undefined1 *)((long)local_8b8 + 1U) != local_800);
              }
              uVar33 = local_8e0 + 4;
              lVar16 = local_8e0 + 7;
              uVar37 = uVar37 + iVar42 * 0x100;
              local_8e0 = uVar33;
            } while (lVar16 < local_700);
            pvVar23 = (void *)(uVar33 & 0xffffffff);
          }
          uVar37 = (uint)pvVar23;
          auVar80 = ZEXT1664(CONCAT412(0x42000000,CONCAT48(0x42000000,0x4200000042000000)));
          if ((int)(uVar37 | 1) < (int)uVar41) {
            local_8e8 = (long)(iVar42 * 2);
            local_8b8 = (_func_int ***)(long)(iVar42 * 4);
            local_890 = (void *)(long)(iVar42 * 6);
            local_8a0 = (long)(iVar42 * 8);
            local_8a8 = (void *)(long)(iVar42 * 10);
            local_810 = (void *)(local_818->cstep * local_818->elemsize);
            local_7f8 = (long)local_818->w * local_818->elemsize;
            uVar37 = uVar37 * iVar42 * 0x40;
            local_808 = CONCAT44(local_808._4_4_,iVar42 * 0x80);
            local_8b0 = (_func_int ***)local_7c0.data;
            local_828 = local_818->data;
            local_820 = (void *)((long)local_8c0 + local_830 * 4);
            local_800 = (undefined1 *)(local_8d8 & 0xffffffff);
            uVar33 = (ulong)pvVar23 & 0xffffffff;
            do {
              local_8e0 = uVar33;
              local_8d0 = (ulong)uVar37;
              fVar111 = 0.0;
              fVar44 = 0.0;
              if (local_8c0 != (void *)0x0) {
                fVar44 = *(float *)((long)local_820 + local_8e0 * 4);
                fVar111 = *(float *)((long)local_820 + local_8e0 * 4 + 4);
              }
              if (0 < iVar42) {
                puVar29 = (undefined8 *)((long)local_7c0.data + (long)(int)uVar37 * 4);
                local_8c8 = (void *)((local_830 + local_8e0) * (long)local_810 + (long)local_828);
                lVar14 = 0;
                do {
                  iVar39 = (int)lVar14 + iVar24;
                  lVar15 = -0x40;
                  auVar53._8_4_ = 0x40000000;
                  auVar53._0_8_ = 0x4000000040000000;
                  auVar53._12_4_ = 0x40000000;
                  auVar109._8_4_ = 0x41800000;
                  auVar109._0_8_ = 0x4180000041800000;
                  auVar109._12_4_ = 0x41800000;
                  auVar118._8_4_ = 0x40800000;
                  auVar118._0_8_ = 0x4080000040800000;
                  auVar118._12_4_ = 0x40800000;
                  auVar48._8_4_ = 0x41000000;
                  auVar48._0_8_ = 0x4100000041000000;
                  auVar48._12_4_ = 0x41000000;
                  auVar46 = auVar80._0_16_;
                  puVar30 = puVar29;
                  do {
                    uVar33 = *(ulong *)((long)puVar30 + local_8e8 * 4);
                    auVar60._8_8_ = 0;
                    auVar60._0_8_ = uVar33;
                    uVar1 = *(ulong *)((long)puVar30 + (long)local_8b8 * 4);
                    auVar67._8_8_ = 0;
                    auVar67._0_8_ = uVar1;
                    auVar73._0_4_ = (float)uVar1 + (float)uVar33;
                    auVar73._4_4_ = (float)(uVar1 >> 0x20) + (float)(uVar33 >> 0x20);
                    auVar73._8_8_ = 0;
                    uVar33 = *(ulong *)((long)puVar30 + (long)local_890 * 4);
                    auVar78._8_8_ = 0;
                    auVar78._0_8_ = uVar33;
                    uVar1 = *(ulong *)((long)puVar30 + local_8a0 * 4);
                    auVar84._8_8_ = 0;
                    auVar84._0_8_ = uVar1;
                    auVar88._0_4_ = (float)uVar1 + (float)uVar33;
                    auVar88._4_4_ = (float)(uVar1 >> 0x20) + (float)(uVar33 >> 0x20);
                    auVar88._8_8_ = 0;
                    uVar33 = *(ulong *)((long)puVar30 + (long)local_8a8 * 4);
                    auVar91._8_8_ = 0;
                    auVar91._0_8_ = uVar33;
                    uVar1 = *(ulong *)((long)puVar30 + (long)(iVar42 * 0xc) * 4);
                    auVar94._8_8_ = 0;
                    auVar94._0_8_ = uVar1;
                    auVar97._0_4_ = (float)uVar1 + (float)uVar33;
                    auVar97._4_4_ = (float)(uVar1 >> 0x20) + (float)(uVar33 >> 0x20);
                    auVar97._8_8_ = 0;
                    auVar103._0_4_ = auVar88._0_4_ + auVar73._0_4_;
                    auVar103._4_4_ = auVar88._4_4_ + auVar73._4_4_;
                    auVar103._8_8_ = 0;
                    auVar45 = vfmadd231ps_fma(auVar103,auVar97,auVar46);
                    auVar99._0_4_ = auVar45._0_4_ + (float)*puVar30;
                    auVar99._4_4_ = auVar45._4_4_ + (float)((ulong)*puVar30 >> 0x20);
                    auVar99._8_4_ = auVar45._8_4_ + 0.0;
                    auVar99._12_4_ = auVar45._12_4_ + 0.0;
                    uVar2 = vmovlps_avx(auVar99);
                    *(undefined8 *)((long)local_620 + lVar15) = uVar2;
                    auVar45 = vsubps_avx(auVar60,auVar67);
                    auVar56 = vsubps_avx(auVar78,auVar84);
                    auVar62 = vsubps_avx(auVar91,auVar94);
                    auVar68 = vfmadd213ps_fma(auVar53,auVar56,auVar45);
                    auVar68 = vfmadd231ps_fma(auVar68,auVar62,auVar109);
                    uVar2 = vmovlps_avx(auVar68);
                    *(undefined8 *)((long)local_5e0 + lVar15) = uVar2;
                    auVar68 = vfmadd213ps_fma(auVar118,auVar88,auVar73);
                    auVar68 = vfmadd231ps_fma(auVar68,auVar97,auVar48);
                    uVar2 = vmovlps_avx(auVar68);
                    *(undefined8 *)((long)local_5a0 + lVar15) = uVar2;
                    auVar68 = vfmadd213ps_fma(auVar48,auVar56,auVar45);
                    auVar68 = vfmadd231ps_fma(auVar68,auVar62,auVar118);
                    uVar2 = vmovlps_avx(auVar68);
                    *(undefined8 *)((long)auStack_560 + lVar15) = uVar2;
                    auVar68 = vfmadd213ps_fma(auVar88,auVar109,auVar73);
                    auVar68 = vfmadd231ps_fma(auVar68,auVar53,auVar97);
                    uVar2 = vmovlps_avx(auVar68);
                    *(undefined8 *)((long)auStack_520 + lVar15) = uVar2;
                    uVar2 = *(undefined8 *)((long)puVar30 + (long)(iVar42 * 0xe) * 4);
                    auVar45 = vfmadd213ps_fma(auVar56,auVar46,auVar45);
                    auVar61._0_4_ = auVar45._0_4_ + auVar62._0_4_ + (float)uVar2;
                    auVar61._4_4_ = auVar45._4_4_ + auVar62._4_4_ + (float)((ulong)uVar2 >> 0x20);
                    auVar61._8_4_ = auVar45._8_4_ + auVar62._8_4_ + 0.0;
                    auVar61._12_4_ = auVar45._12_4_ + auVar62._12_4_ + 0.0;
                    uVar2 = vmovlps_avx(auVar61);
                    *(undefined8 *)((long)auStack_4e0 + lVar15) = uVar2;
                    puVar30 = (undefined8 *)((long)puVar30 + (long)(iVar42 * 0x10) * 4);
                    lVar15 = lVar15 + 8;
                  } while (lVar15 != 0);
                  iVar35 = iVar39 % (int)uVar40;
                  lVar15 = (long)((iVar39 / (int)uVar40) * 6);
                  puVar22 = (undefined4 *)
                            ((long)local_8c8 + (long)(iVar35 * 6) * 4 + local_7f8 * lVar15);
                  pfVar31 = &fStack_624;
                  lVar16 = 0;
                  auVar80 = ZEXT1664(auVar46);
                  do {
                    if (lVar16 < local_7d0 - lVar15) {
                      auVar70 = SUB6416(ZEXT464(0x42000000),0);
                      fVar113 = pfVar31[-7] + pfVar31[-9];
                      fVar114 = pfVar31[-6] + pfVar31[-8];
                      fVar115 = pfVar31[-3] + pfVar31[-5];
                      fVar9 = pfVar31[-5] - pfVar31[-3];
                      fVar5 = pfVar31[-0xb] + fVar44 + pfVar31[-0xd];
                      fVar10 = pfVar31[-4] - pfVar31[-2];
                      auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 + pfVar31[-0xf] + fVar113)),
                                                ZEXT416((uint)fVar115),auVar70);
                      auVar68 = ZEXT416((uint)(pfVar31[-4] + pfVar31[-2]));
                      auVar62 = ZEXT416((uint)(pfVar31[-9] - pfVar31[-7]));
                      fVar6 = pfVar31[-10] + fVar111 + pfVar31[-0xc];
                      fVar106 = pfVar31[-0xe];
                      fVar7 = fVar44 + (pfVar31[-0xd] - pfVar31[-0xb]);
                      fVar8 = fVar111 + (pfVar31[-0xc] - pfVar31[-10]);
                      auVar46 = vfmadd213ss_fma(auVar70,auVar62,ZEXT416((uint)fVar7));
                      fVar110 = pfVar31[-1];
                      auVar95 = ZEXT416((uint)(pfVar31[-8] - pfVar31[-6]));
                      auVar45 = vfmadd213ss_fma(auVar70,auVar95,ZEXT416((uint)fVar8));
                      fVar112 = *pfVar31;
                      *puVar22 = auVar56._0_4_;
                      auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar114 + fVar6 + fVar106)),auVar68,
                                                auVar70);
                      puVar22[(int)uVar43] = auVar56._0_4_;
                      if (iVar35 * 6 + 1 < iVar27) {
                        auVar56 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),auVar95,
                                                  ZEXT416((uint)fVar8));
                        auVar70 = vfmadd231ss_fma(auVar56,ZEXT416((uint)fVar10),
                                                  SUB6416(ZEXT464(0x41800000),0));
                        auVar56 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),auVar62,
                                                  ZEXT416((uint)fVar7));
                        auVar56 = vfmadd231ss_fma(auVar56,SUB6416(ZEXT464(0x41800000),0),
                                                  ZEXT416((uint)fVar9));
                        puVar22[1] = auVar56._0_4_;
                        puVar22[(long)(int)uVar43 + 1] = auVar70._0_4_;
                      }
                      if (iVar35 * 6 + 2 < iVar27) {
                        auVar56 = vfmadd132ss_fma(SUB6416(ZEXT464(0x40800000),0),
                                                  ZEXT416((uint)fVar5),ZEXT416((uint)fVar113));
                        auVar70 = vfmadd231ss_fma(auVar56,SUB6416(ZEXT464(0x41000000),0),
                                                  ZEXT416((uint)fVar115));
                        auVar56 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),
                                                  ZEXT416((uint)fVar114),ZEXT416((uint)fVar6));
                        auVar56 = vfmadd231ss_fma(auVar56,auVar68,SUB6416(ZEXT464(0x41000000),0));
                        puVar22[2] = auVar70._0_4_;
                        puVar22[(long)(int)uVar43 + 2] = auVar56._0_4_;
                      }
                      auVar80 = ZEXT1664(CONCAT412(0x42000000,
                                                   CONCAT48(0x42000000,0x4200000042000000)));
                      if (iVar35 * 6 + 3 < iVar27) {
                        auVar56 = vfmadd213ss_fma(auVar62,SUB6416(ZEXT464(0x41000000),0),
                                                  ZEXT416((uint)fVar7));
                        auVar56 = vfmadd213ss_fma(ZEXT416((uint)fVar9),
                                                  SUB6416(ZEXT464(0x40800000),0),auVar56);
                        auVar62 = vfmadd213ss_fma(auVar95,SUB6416(ZEXT464(0x41000000),0),
                                                  ZEXT416((uint)fVar8));
                        auVar62 = vfmadd213ss_fma(ZEXT416((uint)fVar10),
                                                  SUB6416(ZEXT464(0x40800000),0),auVar62);
                        puVar22[3] = auVar56._0_4_;
                        puVar22[(long)(int)uVar43 + 3] = auVar62._0_4_;
                      }
                      if (iVar35 * 6 + 4 < iVar27) {
                        auVar56 = vfmadd213ss_fma(ZEXT416((uint)fVar113),
                                                  SUB6416(ZEXT464(0x41800000),0),
                                                  ZEXT416((uint)fVar5));
                        auVar56 = vfmadd213ss_fma(ZEXT416((uint)fVar115),
                                                  SUB6416(ZEXT464(0x40000000),0),auVar56);
                        auVar62 = vfmadd213ss_fma(ZEXT416((uint)fVar114),
                                                  SUB6416(ZEXT464(0x41800000),0),
                                                  ZEXT416((uint)fVar6));
                        auVar62 = vfmadd213ss_fma(auVar68,SUB6416(ZEXT464(0x40000000),0),auVar62);
                        puVar22[4] = auVar56._0_4_;
                        puVar22[(long)(int)uVar43 + 4] = auVar62._0_4_;
                      }
                      if (iVar35 * 6 + 5 < iVar27) {
                        puVar22[5] = fVar9 + auVar46._0_4_ + fVar110;
                        puVar22[(long)(int)uVar43 + 5] = fVar10 + auVar45._0_4_ + fVar112;
                      }
                      puVar22 = puVar22 + iVar27;
                    }
                    lVar16 = lVar16 + 1;
                    pfVar31 = pfVar31 + 0x10;
                  } while (lVar16 != 6);
                  lVar14 = lVar14 + 1;
                  puVar29 = puVar29 + 1;
                } while ((undefined1 *)lVar14 != local_800);
              }
              uVar37 = uVar37 + iVar42 * 0x80;
              uVar33 = local_8e0 + 2;
            } while ((long)(local_8e0 + 3) < local_700);
            uVar37 = (uint)(local_8e0 + 2);
          }
          if ((int)uVar37 < (int)uVar41) {
            local_8b8 = (_func_int ***)local_7c0.data;
            iVar39 = local_818->w;
            local_890 = local_818->data;
            sVar4 = local_818->elemsize;
            local_8a0 = local_818->cstep * sVar4;
            local_8e8 = (long)(int)uVar37;
            uVar43 = uVar37 * iVar42 * 0x40;
            local_8a8 = (void *)((long)local_8c0 + local_830 * 4);
            local_8c8 = (void *)(local_8d8 & 0xffffffff);
            do {
              local_8d0 = (ulong)uVar43;
              if (local_8c0 == (void *)0x0) {
                fVar44 = 0.0;
              }
              else {
                fVar44 = *(float *)((long)local_8a8 + local_8e8 * 4);
              }
              if (0 < iVar42) {
                pfVar31 = (float *)((long)local_7c0.data + (long)(int)uVar43 * 4);
                pvVar23 = (void *)0x0;
                do {
                  iVar35 = (int)pvVar23 + iVar24;
                  lVar14 = -0x20;
                  pfVar32 = pfVar31;
                  do {
                    fVar111 = pfVar32[iVar42 * 2] + pfVar32[iVar42];
                    fVar112 = pfVar32[iVar42] - pfVar32[iVar42 * 2];
                    fVar106 = pfVar32[iVar42 * 4] + pfVar32[iVar42 * 3];
                    fVar113 = pfVar32[iVar42 * 3] - pfVar32[iVar42 * 4];
                    fVar110 = pfVar32[iVar42 * 6] + pfVar32[iVar42 * 5];
                    fVar114 = pfVar32[iVar42 * 5] - pfVar32[iVar42 * 6];
                    auVar95 = SUB6416(ZEXT464(0x42000000),0);
                    auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar106 + fVar111 + *pfVar32)),
                                              ZEXT416((uint)fVar110),auVar95);
                    *(int *)((long)&local_640 + lVar14) = auVar46._0_4_;
                    auVar68 = SUB6416(ZEXT464(0x40000000),0);
                    auVar46 = vfmadd213ss_fma(auVar68,ZEXT416((uint)fVar113),ZEXT416((uint)fVar112))
                    ;
                    auVar62 = SUB6416(ZEXT464(0x41800000),0);
                    auVar46 = vfmadd231ss_fma(auVar46,ZEXT416((uint)fVar114),auVar62);
                    *(int *)((long)local_620 + lVar14) = auVar46._0_4_;
                    auVar45 = SUB6416(ZEXT464(0x40800000),0);
                    auVar46 = vfmadd213ss_fma(auVar45,ZEXT416((uint)fVar106),ZEXT416((uint)fVar111))
                    ;
                    auVar56 = SUB6416(ZEXT464(0x41000000),0);
                    auVar46 = vfmadd231ss_fma(auVar46,ZEXT416((uint)fVar110),auVar56);
                    *(int *)((long)local_600 + lVar14) = auVar46._0_4_;
                    auVar46 = vfmadd213ss_fma(auVar56,ZEXT416((uint)fVar113),ZEXT416((uint)fVar112))
                    ;
                    auVar46 = vfmadd231ss_fma(auVar46,ZEXT416((uint)fVar114),auVar45);
                    *(int *)((long)local_5e0 + lVar14) = auVar46._0_4_;
                    auVar46 = vfmadd213ss_fma(ZEXT416((uint)fVar106),auVar62,ZEXT416((uint)fVar111))
                    ;
                    auVar46 = vfmadd231ss_fma(auVar46,auVar68,ZEXT416((uint)fVar110));
                    *(int *)((long)local_5c0 + lVar14) = auVar46._0_4_;
                    auVar46 = vfmadd213ss_fma(ZEXT416((uint)fVar113),auVar95,ZEXT416((uint)fVar112))
                    ;
                    *(float *)((long)local_5a0 + lVar14) =
                         auVar46._0_4_ + fVar114 + pfVar32[iVar42 * 7];
                    pfVar32 = pfVar32 + iVar42 * 8;
                    lVar14 = lVar14 + 4;
                  } while (lVar14 != 0);
                  iVar28 = iVar35 % (int)uVar40;
                  lVar14 = (long)((iVar35 / (int)uVar40) * 6);
                  puVar22 = (undefined4 *)
                            ((long)local_890 +
                            (long)(iVar28 * 6) * 4 +
                            (long)iVar39 * sVar4 * lVar14 + (local_830 + local_8e8) * local_8a0);
                  pfVar32 = afStack_64c + 2;
                  lVar15 = 0;
                  do {
                    if (lVar15 < local_7d0 - lVar14) {
                      fVar106 = pfVar32[-3] + pfVar32[-4];
                      fVar114 = pfVar32[-4] - pfVar32[-3];
                      fVar110 = pfVar32[-1] + pfVar32[-2];
                      fVar115 = pfVar32[-2] - pfVar32[-1];
                      fVar112 = pfVar32[-6] + fVar44 + pfVar32[-5];
                      auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar112 + pfVar32[-7] + fVar106)),
                                                ZEXT416((uint)fVar110),auVar95);
                      fVar113 = (pfVar32[-6] - pfVar32[-5]) + fVar44;
                      auVar46 = vfmadd231ss_fma(ZEXT416((uint)fVar112),ZEXT416((uint)fVar106),
                                                auVar62);
                      auVar107 = vfmadd231ss_fma(auVar46,ZEXT416((uint)fVar110),auVar68);
                      auVar46 = vfmadd213ss_fma(auVar95,ZEXT416((uint)fVar114),
                                                ZEXT416((uint)fVar113));
                      fVar111 = *pfVar32;
                      *puVar22 = auVar70._0_4_;
                      if (iVar28 * 6 + 1 < iVar27) {
                        auVar70 = vfmadd231ss_fma(ZEXT416((uint)fVar113),ZEXT416((uint)fVar114),
                                                  auVar68);
                        auVar70 = vfmadd231ss_fma(auVar70,ZEXT416((uint)fVar115),auVar62);
                        puVar22[1] = auVar70._0_4_;
                      }
                      if (iVar28 * 6 + 2 < iVar27) {
                        auVar70 = vfmadd213ss_fma(ZEXT416((uint)fVar106),auVar45,
                                                  ZEXT416((uint)fVar112));
                        auVar70 = vfmadd213ss_fma(ZEXT416((uint)fVar110),auVar56,auVar70);
                        puVar22[2] = auVar70._0_4_;
                      }
                      if (iVar28 * 6 + 3 < iVar27) {
                        auVar70 = vfmadd213ss_fma(ZEXT416((uint)fVar114),auVar56,
                                                  ZEXT416((uint)fVar113));
                        auVar70 = vfmadd231ss_fma(auVar70,ZEXT416((uint)fVar115),auVar45);
                        puVar22[3] = auVar70._0_4_;
                      }
                      if (iVar28 * 6 + 4 < iVar27) {
                        puVar22[4] = auVar107._0_4_;
                      }
                      if (iVar28 * 6 + 5 < iVar27) {
                        puVar22[5] = auVar46._0_4_ + fVar111 + fVar115;
                      }
                      puVar22 = puVar22 + iVar27;
                    }
                    lVar15 = lVar15 + 1;
                    pfVar32 = pfVar32 + 8;
                  } while (lVar15 != 6);
                  pvVar23 = (void *)((long)pvVar23 + 1);
                  pfVar31 = pfVar31 + 1;
                } while (pvVar23 != local_8c8);
              }
              local_8e8 = local_8e8 + 1;
              uVar43 = uVar43 + local_7ec;
            } while (local_8e8 != local_700);
          }
          uVar33 = (ulong)(iVar24 + local_8ec);
        } while ((int)(iVar24 + local_8ec) < (int)local_7e8);
      }
      piVar11 = (int *)CONCAT44(local_7c0.refcount._4_4_,(int)local_7c0.refcount);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_7c0.allocator == (Allocator *)0x0) {
            if ((_func_int ***)local_7c0.data != (_func_int ***)0x0) {
              free(local_7c0.data);
            }
          }
          else {
            (*(local_7c0.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_7c0.cstep = 0;
      local_7c0.data = (void *)0x0;
      local_7c0.refcount._0_4_ = 0;
      local_7c0.refcount._4_4_ = 0;
      local_7c0.elemsize._0_4_ = 0;
      local_7c0.elempack = 0;
      local_7c0.c = 0;
      local_888 = local_888 + 1;
      local_7c0.elemsize._4_4_ = (int)local_7c0.refcount;
      local_7c0.dims = local_7c0.refcount._4_4_;
      local_7c0.w = (int)local_7c0.elemsize;
      local_7c0.h = (int)local_7c0.refcount;
      local_7c0.d = local_7c0.elempack;
    } while (local_888 != local_7f0);
  }
  piVar11 = (int *)CONCAT44(local_880.refcount._4_4_,(int)local_880.refcount);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_880.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_880.data != (Allocator *)0x0) {
          free(local_880.data);
        }
      }
      else {
        (*(local_880.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_880.cstep = 0;
  local_880.data = (void *)0x0;
  local_880.refcount._0_4_ = 0;
  local_880.refcount._4_4_ = 0;
  local_880.elemsize._0_4_ = 0;
  local_880.elemsize._4_4_ = 0;
  local_880.elempack = 0;
  local_880.dims = 0;
  local_880.w = 0;
  local_880.h = 0;
  local_880.d = 0;
  local_880.c = 0;
  piVar11 = (int *)CONCAT44(local_770.refcount._4_4_,local_770.refcount._0_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_770.allocator == (Allocator *)0x0) {
        if (local_770.data != (void *)0x0) {
          free(local_770.data);
        }
      }
      else {
        (*(local_770.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, const Mat& bias, int nT, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    // pad to 6n+2, winograd F(6,3)
    int w_tiles = (outw + 5) / 6;
    int h_tiles = (outh + 5) / 6;
    int tiles = w_tiles * h_tiles;

    const int M = top_blob.c * top_blob.elempack;
    const int N = tiles;
    const int K = bottom_blob.c * bottom_blob.elempack;
    const int B = 64;

    // NCNN_LOGE("conv3x3s1_winograd63 %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, B, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);

    const int nn_NK = nn_N * nn_K;

    if (nT > 1 && nn_NK < nT)
    {
        Mat B_tile(TILE_N * B * TILE_K, 4u, opt.workspace_allocator);

        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            // transform input
            conv3x3s1_winograd63_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, nT);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, nT);
        }
    }
    else
    {
        Mat B_tileX(TILE_N * B * TILE_K, 1, nT, 4u, opt.workspace_allocator);

        #pragma omp parallel for num_threads(nT)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat B_tile = B_tileX.channel(get_omp_thread_num());

            // transform input
            conv3x3s1_winograd63_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, 1);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, 1);
        }
    }

    Mat top_tileX(TILE_N * B * TILE_M, 1, nT, 4u, opt.workspace_allocator);

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat top_tile = top_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

                const Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

                gemm_transB_packed_tile(AT_tile, BT_tile, top_tile, B, max_ii, max_jj, k, max_kk);
            }

            // transform output
            conv3x3s1_winograd63_transform_output_tile(top_tile, top_blob, bias, i, max_ii, j, max_jj);
        }
    }
}